

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  FieldDescriptor FVar1;
  int number;
  uint32_t uVar2;
  LogMessage *other;
  Message **ppMVar3;
  Message *pMVar4;
  Descriptor *message_type;
  MessageLite *pMVar5;
  ulong uVar6;
  ulong uVar7;
  FieldDescriptor *local_70;
  code *local_68 [7];
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_68[0] = FieldDescriptor::TypeOnceInit;
    local_70 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),local_68,&local_70);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetMessage",CPPTYPE_MESSAGE);
  }
  FVar1 = field[1];
  if (((byte)FVar1 & 8) != 0) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 4);
    message_type = FieldDescriptor::message_type(field);
    pMVar5 = internal::ExtensionSet::GetMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        number,message_type,factory);
    return (Message *)pMVar5;
  }
  uVar7 = *(ulong *)(field + 0x28);
  if ((uVar7 != 0 && ((byte)FVar1 & 0x10) != 0) &&
     ((*(int *)(uVar7 + 4) != 1 || ((*(byte *)(*(long *)(uVar7 + 0x20) + 1) & 2) == 0)))) {
    uVar6 = 0;
    if (((byte)FVar1 & 0x10) == 0) {
      uVar7 = uVar6;
    }
    if (*(int *)(uVar7 + 4) == 1) {
      uVar6 = (ulong)((*(byte *)(*(long *)(uVar7 + 0x20) + 1) & 2) >> 1);
    }
    if ((char)uVar6 != '\0') {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                 ,0x5b7);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)local_68,"CHECK failed: !oneof_descriptor->is_synthetic(): ")
      ;
      internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
      if ((char)uVar6 != '\0') {
        internal::LogMessage::~LogMessage((LogMessage *)local_68);
      }
    }
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)(uVar7 - *(long *)(*(long *)(uVar7 + 0x10) + 0x30) >> 3) *
                              0x33333334 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 4)) goto LAB_0039d2c6;
  }
  ppMVar3 = GetRaw<google::protobuf::Message_const*>(this,message,field);
  if (*ppMVar3 != (Message *)0x0) {
    return *ppMVar3;
  }
LAB_0039d2c6:
  pMVar4 = GetDefaultMessageInstance(this,field);
  return pMVar4;
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return *GetDefaultMessageInstance(field);
    }
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = GetDefaultMessageInstance(field);
    }
    return *result;
  }
}